

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_node::append_child(xml_node *this,xml_node_type type_)

{
  bool bVar1;
  xml_allocator *alloc;
  xml_node_struct *pxVar2;
  xml_node_type parent;
  xml_node n;
  xml_node local_28;
  xml_node local_20;
  
  pxVar2 = this->_root;
  if (pxVar2 == (xml_node_struct *)0x0) {
    parent = node_null;
  }
  else {
    parent = (xml_node_type)pxVar2->header & (node_doctype|node_declaration);
  }
  bVar1 = impl::anon_unknown_0::allow_insert_child(parent,type_);
  if (bVar1) {
    alloc = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(pxVar2);
    pxVar2 = impl::anon_unknown_0::allocate_node(alloc,type_);
    xml_node(&local_20,pxVar2);
    if (local_20._root != (xml_node_struct *)0x0) {
      impl::anon_unknown_0::append_node(local_20._root,this->_root);
      if (type_ == node_declaration) {
        set_name(&local_20,"xml");
      }
      return (xml_node)local_20._root;
    }
  }
  xml_node(&local_28);
  return (xml_node)local_28._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::append_child(xml_node_type type_)
	{
		if (!impl::allow_insert_child(type(), type_)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::append_node(n._root, _root);

		if (type_ == node_declaration) n.set_name(PUGIXML_TEXT("xml"));

		return n;
	}